

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O1

FilterPropagateResult __thiscall
duckdb::CheckZonemapTemplated<long>
          (duckdb *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  long max_value;
  FilterPropagateResult FVar1;
  Value *this_00;
  int64_t constant;
  Value *pVVar2;
  undefined7 in_register_00000011;
  array_ptr_iterator<duckdb::Value> __begin2;
  array_ptr_iterator<duckdb::Value> local_50;
  long local_38;
  
  pVVar2 = constants.ptr;
  local_38 = *(long *)(this + 0x30);
  max_value = *(long *)(this + 0x40);
  local_50.index = 0;
  if (pVVar2 != (Value *)0x0) {
    local_50.ptr = (Value *)CONCAT71(in_register_00000011,comparison_type);
    local_50.size = (idx_t)pVVar2;
    do {
      this_00 = array_ptr_iterator<duckdb::Value>::operator*(&local_50);
      constant = Value::GetValueUnsafe<long>(this_00);
      FVar1 = CheckZonemapTemplated<long>
                        ((BaseStatistics *)this,(ExpressionType)stats,local_38,max_value,constant);
      if (FVar1 < FILTER_ALWAYS_FALSE) {
        return FVar1;
      }
      local_50.index = (idx_t)&((LogicalType *)local_50.index)->physical_type_;
      if (local_50.size <= local_50.index) {
        local_50.index = local_50.size;
      }
    } while (((local_50.ptr != (Value *)CONCAT71(in_register_00000011,comparison_type)) ||
             ((Value *)local_50.index != pVVar2)) || ((Value *)local_50.size != pVVar2));
  }
  return FILTER_ALWAYS_FALSE;
}

Assistant:

int64_t GetNumericValueUnion::Operation(const NumericValueUnion &v) {
	return v.value_.bigint;
}